

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration,int level)

{
  pointer ptVar1;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Obstacle *o_1;
  Car *pCVar6;
  pointer pOVar7;
  thread *t;
  long lVar8;
  pointer ptVar9;
  pointer ptVar10;
  thread *c;
  int iVar11;
  Obstacle *o;
  pointer pOVar12;
  bool bVar13;
  initializer_list<std::shared_ptr<Car>_> __l;
  bool running;
  shared_ptr<Car> car2;
  shared_ptr<Car> car1;
  int local_1dc;
  string direction;
  vector<std::thread,_std::allocator<std::thread>_> cars;
  thread local_1a0;
  vector<Obstacle,_std::allocator<Obstacle>_> obstacles;
  pointer local_158;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> carObjects;
  __shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2> local_128;
  vector<std::thread,_std::allocator<std::thread>_> obstacleThreads;
  string local_c0;
  string local_a0;
  string local_80;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_60;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> local_48;
  
  local_1dc = SDL_GetTicks();
  running = true;
  pCVar6 = (Car *)operator_new(0x68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"horizontal",(allocator<char> *)&obstacleThreads);
  Car::Car(pCVar6,0x1d6,0x1fe,0x280,-1,&local_a0);
  std::__shared_ptr<Car,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Car,void>
            ((__shared_ptr<Car,(__gnu_cxx::_Lock_policy)2> *)&car1,pCVar6);
  std::__cxx11::string::~string((string *)&local_a0);
  pCVar6 = (Car *)operator_new(0x68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"vertical",(allocator<char> *)&obstacleThreads);
  Car::Car(pCVar6,0x25d,0x203,0x280,-1,&local_c0);
  std::__shared_ptr<Car,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Car,void>
            ((__shared_ptr<Car,(__gnu_cxx::_Lock_policy)2> *)&car2,pCVar6);
  std::__cxx11::string::~string((string *)&local_c0);
  cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)Car::move;
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
            ((thread *)&direction,(type *)&obstacleThreads,&car1);
  std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
            (&cars,(thread *)&direction);
  std::thread::~thread((thread *)&direction);
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)Car::move;
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
            ((thread *)&direction,(type *)&obstacleThreads,&car2);
  std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
            (&cars,(thread *)&direction);
  std::thread::~thread((thread *)&direction);
  std::__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2> *)&obstacleThreads,
             &car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2> *)
             &obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             &car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&obstacleThreads;
  std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
            (&carObjects,__l,(allocator_type *)&direction);
  lVar8 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -8);
  obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar11 = 0;
  if (0 < level * 3) {
    iVar11 = level * 3;
  }
  while (pOVar7 = obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar13 = iVar11 != 0, iVar11 = iVar11 + -1,
        bVar13) {
    iVar3 = Randomizer::genRand<int>(1,600);
    iVar4 = Randomizer::genRand<int>(1,600);
    iVar5 = Randomizer::genRand<int>(1,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&direction,"vertical",(allocator<char> *)&obstacleThreads);
    if (iVar5 == 1) {
      std::__cxx11::string::assign((char *)&direction);
    }
    std::__cxx11::string::string((string *)&local_80,(string *)&direction);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
              (&local_48,&carObjects);
    Obstacle::Obstacle((Obstacle *)&obstacleThreads,iVar3,iVar4,600,1,&local_80,&local_48);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector(&local_48);
    std::__cxx11::string::~string((string *)&local_80);
    std::vector<Obstacle,_std::allocator<Obstacle>_>::emplace_back<Obstacle>
              (&obstacles,(Obstacle *)&obstacleThreads);
    Obstacle::~Obstacle((Obstacle *)&obstacleThreads);
    std::__cxx11::string::~string((string *)&direction);
  }
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pOVar12 = obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                 super__Vector_impl_data._M_start; pOVar12 != pOVar7; pOVar12 = pOVar12 + 1) {
    direction._M_dataplus._M_p = (pointer)Obstacle::move;
    direction._M_string_length = 0;
    local_158 = pOVar12;
    std::thread::thread<void(Obstacle::*)(),Obstacle*,void>
              (&local_1a0,(type *)&direction,&local_158);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&obstacleThreads,&local_1a0);
    std::thread::~thread(&local_1a0);
  }
  iVar11 = 0;
  while (ptVar1 = cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        pOVar7 = obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                 super__Vector_impl_data._M_start, running == true) {
    iVar3 = SDL_GetTicks();
    std::__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_128,&car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,&car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>);
    Mycontroller::HandleInput(&running,(shared_ptr<Car> *)&local_128,(shared_ptr<Car> *)&local_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
    bVar13 = Car::isActive(car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((!bVar13) &&
       (bVar13 = Car::isActive(car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
       !bVar13)) {
      bVar13 = Car::get_success(car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      ptVar9 = cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar1 = cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((bVar13) &&
         (bVar13 = Car::get_success(car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         , ptVar9 = cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start,
         ptVar1 = cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish, bVar13)) {
        running = false;
        this->score = (this->score + 1) * level;
        for (pOVar7 = obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pOVar7 != obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                      super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
          pOVar7->_active = false;
        }
      }
      else {
        for (; ptVar9 != ptVar1; ptVar9 = ptVar9 + 1) {
          std::thread::join();
        }
        Car::set_xpos(car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,500);
        Car::set_ypos(car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,500);
        Car::set_xpos(car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x1c2);
        Car::set_ypos(car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,600);
        Car::set_active(car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
        Car::set_active(car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
        cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        std::thread::~thread
                  (cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        std::thread::~thread
                  (cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        direction._M_dataplus._M_p = (pointer)Car::move;
        direction._M_string_length = 0;
        std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                  (&local_1a0,(type *)&direction,&car1);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&cars,&local_1a0);
        std::thread::~thread(&local_1a0);
        direction._M_dataplus._M_p = (pointer)Car::move;
        direction._M_string_length = 0;
        std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                  (&local_1a0,(type *)&direction,&car2);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  (&cars,&local_1a0);
        std::thread::~thread(&local_1a0);
      }
    }
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
              (&local_60,&carObjects);
    Renderer::Render(renderer,&obstacles,&local_60);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector(&local_60);
    iVar4 = SDL_GetTicks();
    iVar11 = iVar11 + 1;
    if (999 < (uint)(iVar4 - local_1dc)) {
      Renderer::UpdateWindowTitle(renderer,this->score,iVar11);
      iVar11 = 0;
      local_1dc = iVar4;
    }
    if ((uint)(iVar4 - iVar3) < target_frame_duration) {
      SDL_Delay((int)target_frame_duration - (iVar4 - iVar3));
    }
  }
  for (; pOVar7 != obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                   super__Vector_impl_data._M_finish; pOVar7 = pOVar7 + 1) {
    pOVar7->_active = false;
  }
  (car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_active = false;
  (car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_active = false;
  for (ptVar9 = cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar2 = obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_finish,
      ptVar10 = obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start, ptVar9 != ptVar1; ptVar9 = ptVar9 + 1) {
    std::thread::join();
  }
  for (; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&obstacleThreads);
  std::vector<Obstacle,_std::allocator<Obstacle>_>::~vector(&obstacles);
  std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector(&carObjects);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&cars);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Game::Run( Renderer &renderer,
               std::size_t target_frame_duration, int level) {
  Uint32 title_timestamp = SDL_GetTicks();
  Uint32 frame_start;
  Uint32 frame_end;
  Uint32 frame_duration;
  int frame_count = 0;
  bool running = true;


//---------Cars ---------------
  std::shared_ptr<Car> car1( new Car {470, 510, 640,-1, "horizontal"});
  std::shared_ptr<Car> car2 (new Car {605, 515, 640, -1, "vertical"});

  std::vector<std::thread> cars ;
  cars.emplace_back(std::thread(&Car::move, car1));
  cars.emplace_back(std::thread(&Car::move, car2));
  std::vector<std::shared_ptr<Car>> carObjects {car1,car2};
//-------------------------------



//--------Obstacles --------------
  std::vector<Obstacle> obstacles;

  for( int i = 0 ; i < level * 3; i++){
    int x = Randomizer::genRand(1,600);
    int y = Randomizer::genRand(1,600);
    int d = Randomizer::genRand(1,2);
    std::string direction = "vertical";

    if(d==1){
      direction = "horizontal";
    }
    //creating more obstacles (in every level)
    Obstacle obstacle {x,y, 600,1,direction,carObjects};
    obstacles.emplace_back(std::move(obstacle));
  }
  std::vector<std::thread> obstacleThreads;

  for ( auto& o : obstacles){
    obstacleThreads.emplace_back(std::thread(&Obstacle::move,&o));
  }
//-------------------------------



  while (running) {
    frame_start = SDL_GetTicks();

    // Input, [Update,] Render - the main game loop.
    //notice that the controller is automatically updating the object positions
    //so no need to create a method update()
    Mycontroller::HandleInput(running,car1,car2);

    
  // if cars are deactivated, then either reset or move to a new level
    if(car1->isActive()==false && car2->isActive() ==false){
       if(car1->get_success()==true && car2->get_success() ==true){
          running = false;
          score++;
          score *= level;
          for(auto& o : obstacles){
            o.deactivate();
          }
      }else{

      for(auto& c : cars){
        //std::cout <<"trying to join\n"<<std::endl;
        c.join();
        //std::cout <<"success  join\n"<<std::endl;
      }

      car1->set_xpos(500);
      car1->set_ypos(500);
      car2->set_xpos(450);
      car2->set_ypos(600);
      car1->set_active(true);
      car2->set_active(true);
       
      cars.pop_back();
      cars.pop_back();
       
      cars.emplace_back(std::thread(&Car::move, car1));
      cars.emplace_back(std::thread(&Car::move, car2));
      }

    }

    
    renderer.Render(obstacles, carObjects);

    frame_end = SDL_GetTicks();

    // Keep track of how long each loop through the input/update/render cycle
    // takes.
    frame_count++;
    frame_duration = frame_end - frame_start;

    // After every second, update the window title.
    if (frame_end - title_timestamp >= 1000) {
      renderer.UpdateWindowTitle(score, frame_count);
      frame_count = 0;
      title_timestamp = frame_end;
    }

    // If the time for this frame is too small (i.e. frame_duration is
    // smaller than the target ms_per_frame), delay the loop to
    // achieve the correct frame rate.
    if (frame_duration < target_frame_duration) {
      SDL_Delay(target_frame_duration - frame_duration);
    }
  }


// make sure that all threads will stop and join
  for(auto& o : obstacles){
    o.deactivate();
  }
  
  car1->deactivate();
  car2->deactivate();

for( auto& t : cars){
  t.join();
}

for(auto& t : obstacleThreads){
  t.join();
}
}